

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void printModel(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *in_RDI;
  int varsPerLine;
  int v;
  FILE *f;
  int local_14;
  
  __stream = fopen(in_RDI,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"c Satisfiability model produced by sgen4\n");
    fprintf(__stream,"c %s\n",commandLine);
    fprintf(__stream,"s SATISFIABLE\n");
    for (local_14 = 1; local_14 <= numOfVariables; local_14 = local_14 + 1) {
      if (local_14 % 0x14 == 1) {
        fprintf(__stream,"v ");
      }
      iVar1 = unPermuteVar(local_14);
      fprintf(__stream,"%d ",(ulong)(uint)(iVar1 * model[local_14]));
      if (local_14 % 0x14 == 0) {
        fprintf(__stream,"\n");
      }
    }
    if (numOfVariables % 0x14 == 0) {
      fprintf(__stream,"v ");
    }
    fprintf(__stream,"0 \n");
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"Unable to write model to file <%s>\n",in_RDI);
  exit(0);
}

Assistant:

void printModel (char *filename)
{
    FILE *f;
    int v, varsPerLine;

    f = fopen (filename, "w");
    if (f != NULL)
    {
        fprintf (f, "c Satisfiability model produced by sgen4\n");
        fprintf (f, "c %s\n", commandLine);
        fprintf (f, "s SATISFIABLE\n");

        varsPerLine = 20;

        for (v=1;v<=numOfVariables;v++)
        {
            if ( v % varsPerLine == 1)
                fprintf (f, "v ");
            fprintf (f, "%d ", unPermuteVar(v)*model[v]);
            if (v % varsPerLine == 0)
                fprintf (f, "\n");
        }
        if (numOfVariables % varsPerLine == 0)
            fprintf (f, "v ");
        fprintf (f, "0 \n");
        fclose (f);
    }
    else
    {
        fprintf (stderr, "Unable to write model to file <%s>\n", filename);
        exit(0);
    }

}